

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTable *table_00;
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column_00;
  char local_50;
  ImGuiTableColumn *other_column;
  int other_column_n_1;
  ImGuiTableColumn *column;
  int other_column_n;
  ImGuiTableColumnIdx sort_order_max;
  ImGuiTable *table;
  ImGuiContext *g;
  bool append_to_sort_specs_local;
  ImGuiSortDirection sort_direction_local;
  int column_n_local;
  
  table_00 = GImGui->CurrentTable;
  g._7_1_ = append_to_sort_specs;
  if ((table_00->Flags & 0x4000000U) == 0) {
    g._7_1_ = 0;
  }
  if (((table_00->Flags & 0x8000000U) == 0) && (sort_direction == 0)) {
    __assert_fail("sort_direction != ImGuiSortDirection_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                  ,0xa74,"void ImGui::TableSetColumnSortDirection(int, ImGuiSortDirection, bool)");
  }
  column._7_1_ = '\0';
  if ((g._7_1_ & 1) != 0) {
    for (column._0_4_ = 0; (int)column < table_00->ColumnsCount; column._0_4_ = (int)column + 1) {
      pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,(int)column);
      column._7_1_ = ImMax<signed_char>(column._7_1_,pIVar1->SortOrder);
    }
  }
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,column_n);
  pIVar1->field_0x65 = pIVar1->field_0x65 & 0xfc | (byte)sort_direction & 3;
  if ((pIVar1->field_0x65 & 3) == 0) {
    pIVar1->SortOrder = -1;
  }
  else if ((pIVar1->SortOrder == -1) || ((g._7_1_ & 1) == 0)) {
    if ((g._7_1_ & 1) == 0) {
      local_50 = '\0';
    }
    else {
      local_50 = column._7_1_ + '\x01';
    }
    pIVar1->SortOrder = local_50;
  }
  for (other_column._4_4_ = 0; other_column._4_4_ < table_00->ColumnsCount;
      other_column._4_4_ = other_column._4_4_ + 1) {
    column_00 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,other_column._4_4_);
    if ((column_00 != pIVar1) && ((g._7_1_ & 1) == 0)) {
      column_00->SortOrder = -1;
    }
    TableFixColumnSortDirection(table_00,column_00);
  }
  table_00->IsSettingsDirty = true;
  table_00->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}